

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double * __thiscall
ON_PlaneEquation::ValueAt
          (ON_PlaneEquation *this,int Pcount,ON_3dPoint *P,double *value,double *value_range)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  
  if (P != (ON_3dPoint *)0x0 && 0 < Pcount) {
    uVar1 = (ulong)(uint)Pcount;
    if (value == (double *)0x0) {
      value = (double *)onmalloc(uVar1 << 3);
    }
    if (value != (double *)0x0) {
      if (value_range == (double *)0x0) {
        if (Pcount < 1) {
          return value;
        }
        pdVar3 = &P->z;
        uVar4 = 0;
        do {
          value[uVar4] = this->z * *pdVar3 +
                         this->x * ((ON_3dPoint *)(pdVar3 + -2))->x + this->y * pdVar3[-1] + this->d
          ;
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + 3;
        } while (uVar1 != uVar4);
        return value;
      }
      dVar6 = this->z * P->z + this->x * P->x + this->y * P->y + this->d;
      *value = dVar6;
      *value_range = dVar6;
      value_range[1] = dVar6;
      if (Pcount < 2) {
        return value;
      }
      pdVar3 = value_range + 1;
      pdVar2 = &P[1].z;
      uVar4 = 1;
      do {
        dVar6 = this->z * *pdVar2 +
                this->x * ((ON_3dPoint *)(pdVar2 + -2))->x + this->y * pdVar2[-1] + this->d;
        value[uVar4] = dVar6;
        pdVar5 = value_range;
        if ((dVar6 < *value_range) || (pdVar5 = pdVar3, *pdVar3 <= dVar6 && dVar6 != *pdVar3)) {
          *pdVar5 = dVar6;
        }
        uVar4 = uVar4 + 1;
        pdVar2 = pdVar2 + 3;
      } while (uVar1 != uVar4);
      return value;
    }
  }
  return (double *)0x0;
}

Assistant:

double* ON_PlaneEquation::ValueAt(
      int Pcount,
      const ON_3dPoint* P,
      double* value,
      double value_range[2]
      ) const
{
  if ( Pcount <= 0 || 0 == P )
    return 0;

  int i;
  double s;
  const double* e = &x;

  if ( 0 == value )
    value =  (double*)onmalloc(Pcount * sizeof(*value) );
  if ( 0 == value )
    return 0;

  if ( 0 != value_range )
  {
    value[0] = s = e[0]*(P[0].x) + e[1]*(P[0].y) + e[2]*(P[0].z) + e[3];
    value_range[0] = s;
    value_range[1] = s;
    for ( i = 1; i < Pcount; i++ )
    {
      value[i] = s = e[0]*(P[i].x) + e[1]*(P[i].y) + e[2]*(P[i].z) + e[3];
      if ( s < value_range[0] )
        value_range[0] = s;
      else if ( s > value_range[1] )
        value_range[1] = s;
    }
  }
  else
  {
    for ( i = 0; i < Pcount; i++ )
    {
      value[i] = e[0]*(P[i].x) + e[1]*(P[i].y) + e[2]*(P[i].z) + e[3];
    }
  }

  return value;
}